

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>
           ._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcNamedUnit).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper
           + (long)p_Var3);
  plVar2 = (long *)((this->Name).field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x10] = 0x882320;
  plVar2[2] = 0x882370;
  plVar2[-9] = 0x882348;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  if (*(code **)(p_Var1 + 0x48) != p_Var1 + 0x58) {
    operator_delete(*(code **)(p_Var1 + 0x48),*(long *)(p_Var1 + 0x58) + 1);
  }
  *(undefined8 *)p_Var1 = 0x882398;
  *(undefined8 *)(p_Var1 + 0x90) = 0x8823c0;
  if (*(code **)(p_Var1 + 0x18) != p_Var1 + 0x28) {
    operator_delete(*(code **)(p_Var1 + 0x18),*(long *)(p_Var1 + 0x28) + 1);
  }
  operator_delete(p_Var1,0xa8);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}